

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

int polyroot(double *coeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  uint uVar1;
  int iVar2;
  double *OPR;
  double *OPI;
  double *pdVar3;
  ulong uVar4;
  
  uVar1 = DEGREE + 1;
  OPR = (double *)malloc((long)(int)uVar1 << 3);
  OPI = (double *)malloc((long)(int)uVar1 << 3);
  if (-1 < DEGREE) {
    uVar4 = 0;
    memset(OPI,0,(ulong)uVar1 * 8);
    pdVar3 = coeff + (uint)DEGREE;
    do {
      OPR[uVar4] = *pdVar3;
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + -1;
    } while (uVar1 != uVar4);
  }
  iVar2 = cpoly(OPR,OPI,DEGREE,ZEROR,ZEROI);
  free(OPR);
  free(OPI);
  return iVar2;
}

Assistant:

int polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - coeff[0] + coeff[1] * x^1 + coeff[2] * x^2 + ---- + coeff[DEGREE+1] * x^DEGREE 

	The program fails if there are leading zeros. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail,i,N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = coeff[N - 1 - i];
		OPI[i] = 0.0;
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}